

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLut.cpp
# Opt level: O0

void anon_unknown.dwarf_142438::testRgbaLut(void)

{
  bool bVar1;
  Rgba *pRVar2;
  float fVar3;
  int x_3;
  int y_3;
  Box2i dw;
  int x_2;
  int y_2;
  int x_1;
  int y_1;
  int x;
  int y;
  RgbaLut lut;
  Array2D<Imf_3_2::Rgba> rgba;
  int NY;
  int NX;
  undefined8 in_stack_fffffffffffffeb8;
  Array2D<Imf_3_2::Rgba> *in_stack_fffffffffffffec0;
  Vec2<int> *in_stack_fffffffffffffec8;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffee0;
  RgbaChannels chn;
  _func_half_half *in_stack_fffffffffffffee8;
  RgbaLut *in_stack_fffffffffffffef0;
  long in_stack_ffffffffffffff00;
  long in_stack_ffffffffffffff08;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff10;
  Vec2<int> local_84;
  int local_7c;
  int local_78;
  Vec2<int> local_74;
  Vec2<int> local_6c;
  Box<Imath_3_2::Vec2<int>_> local_64;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  Rgba local_30 [2];
  Array2D<Imf_3_2::Rgba> local_20;
  undefined4 local_8;
  undefined4 local_4;
  
  chn = (RgbaChannels)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_4 = 0x43;
  local_8 = 0x1f;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  Imf_3_2::RgbaLut::RgbaLut<Imath_3_2::half(*)(Imath_3_2::half)>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,chn);
  for (local_40 = 0; local_40 < 0x1f; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < 0x43; local_44 = local_44 + 1) {
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_40);
      Imath_3_2::half::operator=
                ((half *)in_stack_fffffffffffffec0,(float)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
                );
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_40);
      Imath_3_2::half::operator=
                ((half *)in_stack_fffffffffffffec0,(float)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
                );
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_40);
      Imath_3_2::half::operator=
                ((half *)in_stack_fffffffffffffec0,(float)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
                );
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_40);
      Imath_3_2::half::operator=
                ((half *)in_stack_fffffffffffffec0,(float)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
                );
    }
  }
  pRVar2 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,0);
  Imf_3_2::RgbaLut::apply(local_30,(int)pRVar2,0x81d);
  local_48 = 0;
  do {
    if (0x1e < local_48) {
      for (local_50 = 0; local_50 < 0x1f; local_50 = local_50 + 1) {
        for (local_54 = 0; local_54 < 0x43; local_54 = local_54 + 1) {
          Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_50);
          Imath_3_2::half::operator=
                    ((half *)in_stack_fffffffffffffec0,
                     (float)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
          Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_50);
          Imath_3_2::half::operator=
                    ((half *)in_stack_fffffffffffffec0,
                     (float)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
          Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_50);
          Imath_3_2::half::operator=
                    ((half *)in_stack_fffffffffffffec0,
                     (float)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
          Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_50);
          Imath_3_2::half::operator=
                    ((half *)in_stack_fffffffffffffec0,
                     (float)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        }
      }
      Imath_3_2::Vec2<int>::Vec2(&local_6c,3,5);
      Imath_3_2::Vec2<int>::Vec2(&local_74,0x2d,0x1b);
      Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (Vec2<int> *)in_stack_fffffffffffffec0);
      pRVar2 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,0);
      Imf_3_2::RgbaLut::apply(local_30,(int)pRVar2,1,(Box *)0x43);
      local_78 = 0;
      do {
        if (0x1e < local_78) {
          Imf_3_2::RgbaLut::~RgbaLut((RgbaLut *)0x1d230c);
          Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(in_stack_fffffffffffffec0);
          return;
        }
        for (local_7c = 0; local_7c < 0x43; local_7c = local_7c + 1) {
          Imath_3_2::Vec2<int>::Vec2(&local_84,local_7c,local_78);
          bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::intersects(&local_64,&local_84);
          if (bVar1) {
            Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_78);
            fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffec0);
            if ((fVar3 != 1.0) || (NAN(fVar3))) {
              __assert_fail("rgba[y][x].r == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                            ,0x8f,"void (anonymous namespace)::testRgbaLut()");
            }
            Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_78);
            fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffec0);
            if ((fVar3 != 1.0) || (NAN(fVar3))) {
              __assert_fail("rgba[y][x].g == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                            ,0x90,"void (anonymous namespace)::testRgbaLut()");
            }
            Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_78);
            fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffec0);
            if ((fVar3 != 1.0) || (NAN(fVar3))) {
              __assert_fail("rgba[y][x].b == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                            ,0x91,"void (anonymous namespace)::testRgbaLut()");
            }
            Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_78);
            fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffec0);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              __assert_fail("rgba[y][x].a == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                            ,0x92,"void (anonymous namespace)::testRgbaLut()");
            }
          }
          else {
            Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_78);
            fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffec0);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              __assert_fail("rgba[y][x].r == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                            ,0x96,"void (anonymous namespace)::testRgbaLut()");
            }
            Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_78);
            fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffec0);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              __assert_fail("rgba[y][x].g == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                            ,0x97,"void (anonymous namespace)::testRgbaLut()");
            }
            in_stack_fffffffffffffec0 =
                 (Array2D<Imf_3_2::Rgba> *)
                 Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_78);
            fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffec0);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              __assert_fail("rgba[y][x].b == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                            ,0x98,"void (anonymous namespace)::testRgbaLut()");
            }
            Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_78);
            fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffec0);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              __assert_fail("rgba[y][x].a == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                            ,0x99,"void (anonymous namespace)::testRgbaLut()");
            }
          }
        }
        local_78 = local_78 + 1;
      } while( true );
    }
    for (local_4c = 0; local_4c < 0x43; local_4c = local_4c + 1) {
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_48);
      fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffec0);
      if ((fVar3 != 1.0) || (NAN(fVar3))) {
        __assert_fail("rgba[y][x].r == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                      ,0x6f,"void (anonymous namespace)::testRgbaLut()");
      }
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_48);
      fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffec0);
      if ((fVar3 != 1.0) || (NAN(fVar3))) {
        __assert_fail("rgba[y][x].g == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                      ,0x70,"void (anonymous namespace)::testRgbaLut()");
      }
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_48);
      fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffec0);
      if ((fVar3 != 1.0) || (NAN(fVar3))) {
        __assert_fail("rgba[y][x].b == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                      ,0x71,"void (anonymous namespace)::testRgbaLut()");
      }
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,(long)local_48);
      fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffec0);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        __assert_fail("rgba[y][x].a == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                      ,0x72,"void (anonymous namespace)::testRgbaLut()");
      }
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

void
testRgbaLut ()
{
    const int NX = 67;
    const int NY = 31;

    Array2D<Rgba> rgba (NY, NX);
    RgbaLut       lut (one, WRITE_RGB);

    //
    // apply (data, nData, stride);
    //

    for (int y = 0; y < NY; ++y)
    {
        for (int x = 0; x < NX; ++x)
        {
            rgba[y][x].r = 0;
            rgba[y][x].g = 0;
            rgba[y][x].b = 0;
            rgba[y][x].a = 0;
        }
    }

    lut.apply (&rgba[0][0], NX * NY, 1);

    for (int y = 0; y < NY; ++y)
    {
        for (int x = 0; x < NX; ++x)
        {
            assert (rgba[y][x].r == 1);
            assert (rgba[y][x].g == 1);
            assert (rgba[y][x].b == 1);
            assert (rgba[y][x].a == 0);
        }
    }

    //
    // apply (base, xStride, yStride, dataWindow);
    //

    for (int y = 0; y < NY; ++y)
    {
        for (int x = 0; x < NX; ++x)
        {
            rgba[y][x].r = 0;
            rgba[y][x].g = 0;
            rgba[y][x].b = 0;
            rgba[y][x].a = 0;
        }
    }

    Box2i dw (V2i (3, 5), V2i (45, 27));

    lut.apply (&rgba[0][0], 1, NX, dw);

    for (int y = 0; y < NY; ++y)
    {
        for (int x = 0; x < NX; ++x)
        {
            if (dw.intersects (V2i (x, y)))
            {
                assert (rgba[y][x].r == 1);
                assert (rgba[y][x].g == 1);
                assert (rgba[y][x].b == 1);
                assert (rgba[y][x].a == 0);
            }
            else
            {
                assert (rgba[y][x].r == 0);
                assert (rgba[y][x].g == 0);
                assert (rgba[y][x].b == 0);
                assert (rgba[y][x].a == 0);
            }
        }
    }
}